

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  pointer pUVar1;
  TransactionContext *this_00;
  SchnorrSignature *signature_00;
  SchnorrPubkey *this_01;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 extraout_RAX;
  CfdException *pCVar5;
  AbstractTxIn *this_02;
  pointer utxo;
  ByteData256 sighash;
  ByteData hash;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData target_utxo;
  undefined1 local_640 [16];
  undefined1 local_630 [56];
  OutPoint local_5f8;
  ByteData local_5d0;
  TransactionContext *local_5b8;
  SchnorrSignature *local_5b0;
  SchnorrPubkey *local_5a8;
  ByteData *local_5a0;
  AbstractTxIn *local_598;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_590;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_588;
  undefined1 local_564 [92];
  Script local_508 [9];
  Amount local_2f8 [44];
  
  local_630._48_8_ = outpoint;
  local_590 = utxo_list;
  UtxoData::UtxoData((UtxoData *)(local_564 + 0xc));
  local_588.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (&local_588,
             ((long)(this->super_Transaction).vin_.
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_Transaction).vin_.
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
  this_02 = &((this->super_Transaction).vin_.
              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxIn;
  local_598 = &((this->super_Transaction).vin_.
                super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  local_5b8 = this;
  local_5b0 = signature;
  local_5a8 = pubkey;
  if (this_02 != local_598) {
    local_5a0 = annex;
    do {
      core::AbstractTxIn::GetTxid((Txid *)local_640,this_02);
      uVar3 = core::AbstractTxIn::GetVout(this_02);
      core::OutPoint::OutPoint(&local_5f8,(Txid *)local_640,uVar3);
      local_640._0_8_ = &PTR__Txid_0086d9f8;
      if ((pointer)local_640._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_640._8_8_,local_630._8_8_ - local_640._8_8_);
      }
      utxo = (local_590->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
             super__Vector_impl_data._M_start;
      pUVar1 = (local_590->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (utxo == pUVar1) {
LAB_003cba10:
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_640._0_8_ = local_630;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_640,"Utxo is not found. VerifyInputSchnorrSignature fail.","");
        core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_640);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_630._44_4_ = 0;
      do {
        while( true ) {
          core::AbstractTxIn::GetTxid((Txid *)local_640,this_02);
          bVar2 = core::Txid::Equals((Txid *)local_640,&utxo->txid);
          if (bVar2) break;
          local_640._0_8_ = &PTR__Txid_0086d9f8;
          if ((pointer)local_640._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_640._8_8_,local_630._8_8_ - local_640._8_8_);
          }
LAB_003cb815:
          utxo = utxo + 1;
          if (utxo == pUVar1) {
            if ((local_630._44_4_ & 1) == 0) goto LAB_003cba10;
            goto LAB_003cb830;
          }
        }
        uVar4 = core::AbstractTxIn::GetVout(this_02);
        uVar3 = utxo->vout;
        local_640._0_8_ = &PTR__Txid_0086d9f8;
        if ((pointer)local_640._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_640._8_8_,local_630._8_8_ - local_640._8_8_);
        }
        if (uVar4 != uVar3) goto LAB_003cb815;
        GetLockingScriptFromUtxoData((Script *)local_640,utxo);
        std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
        emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                  ((vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>> *)&local_588,
                   &utxo->amount,(Script *)local_640);
        bVar2 = core::OutPoint::operator==((OutPoint *)local_630._48_8_,&local_5f8);
        if (bVar2) {
          UtxoData::operator=((UtxoData *)(local_564 + 0xc),utxo);
          core::Script::operator=(local_508,(Script *)local_640);
        }
        core::Script::~Script((Script *)local_640);
        utxo = utxo + 1;
        local_630._44_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      } while (utxo != pUVar1);
LAB_003cb830:
      local_5f8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
      if (local_5f8.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5f8.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_5f8.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5f8.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this_02 = this_02 + 1;
      annex = local_5a0;
    } while (this_02 != local_598);
  }
  bVar2 = core::Amount::operator==(local_2f8,0);
  this_01 = local_5a8;
  signature_00 = local_5b0;
  this_00 = local_5b8;
  if (bVar2) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_640._0_8_ = local_630;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_640,"OutPoint is not found into utxo_list.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_640);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar2 = core::Script::IsTaprootScript(local_508);
  if (!bVar2) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_640._0_8_ = local_630;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_640,"Target OutPoint is not taproot.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_640);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             local_640,local_508);
  core::ScriptElement::GetBinaryData
            ((ByteData *)&local_5f8,(ScriptElement *)(local_640._0_8_ + 0x60));
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             local_640);
  core::SchnorrPubkey::GetData((ByteData *)local_640,this_01);
  bVar2 = core::ByteData::Equals((ByteData *)&local_5f8,(ByteData *)local_640);
  if ((pointer)local_640._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_640._0_8_,local_630._0_8_ - local_640._0_8_);
  }
  if (!bVar2) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_640._0_8_ = local_630;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_640,"Unmatch locking script.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_640);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = (*(this_00->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0xf])
                    (this_00,local_630._48_8_);
  core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_564);
  if (annex == (ByteData *)0x0) {
    core::ByteData::ByteData(&local_5d0);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5d0,&annex->data_);
  }
  core::Transaction::GetSchnorrSignatureHash
            ((ByteData256 *)local_640,&this_00->super_Transaction,uVar3,(SigHashType *)local_564,
             &local_588,(TapScriptData *)0x0,&local_5d0);
  if (local_5d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  bVar2 = core::SchnorrPubkey::Verify(this_01,signature_00,(ByteData256 *)local_640);
  if ((pointer)local_640._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_640._0_8_,local_630._0_8_ - local_640._0_8_);
  }
  if (local_5f8.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_5f8.txid_._vptr_Txid,
                    (long)local_5f8.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_5f8.txid_._vptr_Txid);
  }
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&local_588);
  UtxoData::~UtxoData((UtxoData *)(local_564 + 0xc));
  return bVar2;
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}